

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutMerge.c
# Opt level: O0

Cut_Cut_t * Cut_CutMergeTwo3(Cut_Man_t *p,Cut_Cut_t *pCut0,Cut_Cut_t *pCut1)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  Cut_Cut_t *pCVar4;
  long lVar5;
  int local_50;
  uint local_4c;
  int c;
  int k;
  int i;
  int nLeaves1;
  int nLeaves0;
  int Limit;
  int *pLeaves;
  Cut_Cut_t *pRes;
  Cut_Cut_t *pCut1_local;
  Cut_Cut_t *pCut0_local;
  Cut_Man_t *p_local;
  
  if (*(uint *)pCut0 >> 0x1c < *(uint *)pCut1 >> 0x1c) {
    __assert_fail("pCut0->nLeaves >= pCut1->nLeaves",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/cut/cutMerge.c"
                  ,0x11c,"Cut_Cut_t *Cut_CutMergeTwo3(Cut_Man_t *, Cut_Cut_t *, Cut_Cut_t *)");
  }
  if (p->pReady == (Cut_Cut_t *)0x0) {
    pCVar4 = Cut_CutAlloc(p);
    p->pReady = pCVar4;
  }
  pCVar4 = p->pReady;
  uVar1 = p->pParams->nVarsMax;
  uVar2 = *(uint *)pCut0 >> 0x1c;
  uVar3 = *(uint *)pCut1 >> 0x1c;
  if (uVar2 == uVar1) {
    if (uVar3 == uVar1) {
      for (c = 0; c < (int)uVar2; c = c + 1) {
        *(undefined4 *)(&pCVar4[1].field_0x0 + (long)c * 4) =
             *(undefined4 *)(&pCut0[1].field_0x0 + (long)c * 4);
        if (*(int *)(&pCVar4[1].field_0x0 + (long)c * 4) !=
            *(int *)(&pCut1[1].field_0x0 + (long)c * 4)) {
          return (Cut_Cut_t *)0x0;
        }
      }
    }
    else {
      local_4c = 0;
      for (c = 0; c < (int)uVar2; c = c + 1) {
        *(undefined4 *)(&pCVar4[1].field_0x0 + (long)c * 4) =
             *(undefined4 *)(&pCut0[1].field_0x0 + (long)c * 4);
        if (((local_4c != uVar3) &&
            (*(int *)(&pCut1[1].field_0x0 + (long)(int)local_4c * 4) <=
             *(int *)(&pCVar4[1].field_0x0 + (long)c * 4))) &&
           (lVar5 = (long)(int)local_4c, local_4c = local_4c + 1,
           *(int *)(&pCVar4[1].field_0x0 + (long)c * 4) != *(int *)(&pCut1[1].field_0x0 + lVar5 * 4)
           )) {
          return (Cut_Cut_t *)0x0;
        }
      }
      if ((int)local_4c < (int)uVar3) {
        return (Cut_Cut_t *)0x0;
      }
    }
    *(uint *)p->pReady = *(uint *)p->pReady & 0xfffffff | uVar2 << 0x1c;
    p_local = (Cut_Man_t *)p->pReady;
    p->pReady = (Cut_Cut_t *)0x0;
  }
  else {
    local_4c = 0;
    c = 0;
    for (local_50 = 0; local_50 < (int)uVar1; local_50 = local_50 + 1) {
      if (local_4c == uVar3) {
        if (c == uVar2) {
          *(uint *)p->pReady = *(uint *)p->pReady & 0xfffffff | local_50 << 0x1c;
          pCVar4 = p->pReady;
          p->pReady = (Cut_Cut_t *)0x0;
          return pCVar4;
        }
        *(undefined4 *)(&pCVar4[1].field_0x0 + (long)local_50 * 4) =
             *(undefined4 *)(&pCut0[1].field_0x0 + (long)c * 4);
        c = c + 1;
      }
      else if (c == uVar2) {
        if (local_4c == uVar3) {
          *(uint *)p->pReady = *(uint *)p->pReady & 0xfffffff | local_50 << 0x1c;
          pCVar4 = p->pReady;
          p->pReady = (Cut_Cut_t *)0x0;
          return pCVar4;
        }
        *(undefined4 *)(&pCVar4[1].field_0x0 + (long)local_50 * 4) =
             *(undefined4 *)(&pCut1[1].field_0x0 + (long)(int)local_4c * 4);
        local_4c = local_4c + 1;
      }
      else if (*(int *)(&pCut0[1].field_0x0 + (long)c * 4) <
               *(int *)(&pCut1[1].field_0x0 + (long)(int)local_4c * 4)) {
        *(undefined4 *)(&pCVar4[1].field_0x0 + (long)local_50 * 4) =
             *(undefined4 *)(&pCut0[1].field_0x0 + (long)c * 4);
        c = c + 1;
      }
      else if (*(int *)(&pCut1[1].field_0x0 + (long)(int)local_4c * 4) <
               *(int *)(&pCut0[1].field_0x0 + (long)c * 4)) {
        *(undefined4 *)(&pCVar4[1].field_0x0 + (long)local_50 * 4) =
             *(undefined4 *)(&pCut1[1].field_0x0 + (long)(int)local_4c * 4);
        local_4c = local_4c + 1;
      }
      else {
        *(undefined4 *)(&pCVar4[1].field_0x0 + (long)local_50 * 4) =
             *(undefined4 *)(&pCut0[1].field_0x0 + (long)c * 4);
        local_4c = local_4c + 1;
        c = c + 1;
      }
    }
    if ((c < (int)uVar2) || ((int)local_4c < (int)uVar3)) {
      p_local = (Cut_Man_t *)0x0;
    }
    else {
      *(uint *)p->pReady = *(uint *)p->pReady & 0xfffffff | local_50 << 0x1c;
      p_local = (Cut_Man_t *)p->pReady;
      p->pReady = (Cut_Cut_t *)0x0;
    }
  }
  return (Cut_Cut_t *)p_local;
}

Assistant:

Cut_Cut_t * Cut_CutMergeTwo3( Cut_Man_t * p, Cut_Cut_t * pCut0, Cut_Cut_t * pCut1 )
{ 
    Cut_Cut_t * pRes;
    int * pLeaves;
    int Limit, nLeaves0, nLeaves1;
    int i, k, c;

    assert( pCut0->nLeaves >= pCut1->nLeaves );

    // prepare the cut
    if ( p->pReady == NULL )
        p->pReady = Cut_CutAlloc( p );
    pLeaves = p->pReady->pLeaves;

    // consider two cuts
    Limit = p->pParams->nVarsMax;
    nLeaves0 = pCut0->nLeaves;
    nLeaves1 = pCut1->nLeaves;
    if ( nLeaves0 == Limit )
    { // the case when one of the cuts is the largest
        if ( nLeaves1 == Limit )
        { // the case when both cuts are the largest
            for ( i = 0; i < nLeaves0; i++ )
            {
                pLeaves[i] = pCut0->pLeaves[i];
                if ( pLeaves[i] != pCut1->pLeaves[i] )
                    return NULL;
            }
        }
        else
        {
            for ( i = k = 0; i < nLeaves0; i++ )
            {
                pLeaves[i] = pCut0->pLeaves[i];
                if ( k == (int)nLeaves1 )
                    continue;
                if ( pLeaves[i] < pCut1->pLeaves[k] )
                    continue;
                if ( pLeaves[i] == pCut1->pLeaves[k++] )
                    continue;
                return NULL;
            }
            if ( k < nLeaves1 )
                return NULL;
        }
        p->pReady->nLeaves = nLeaves0;
        pRes = p->pReady;  p->pReady = NULL;
        return pRes;
    }

    // compare two cuts with different numbers
    i = k = 0;
    for ( c = 0; c < Limit; c++ )
    {
        if ( k == nLeaves1 )
        {
            if ( i == nLeaves0 )
            {
                p->pReady->nLeaves = c;
                pRes = p->pReady;  p->pReady = NULL;
                return pRes;
            }
            pLeaves[c] = pCut0->pLeaves[i++];
            continue;
        }
        if ( i == nLeaves0 )
        {
            if ( k == nLeaves1 )
            {
                p->pReady->nLeaves = c;
                pRes = p->pReady;  p->pReady = NULL;
                return pRes;
            }
            pLeaves[c] = pCut1->pLeaves[k++];
            continue;
        }
        if ( pCut0->pLeaves[i] < pCut1->pLeaves[k] )
        {
            pLeaves[c] = pCut0->pLeaves[i++];
            continue;
        }
        if ( pCut0->pLeaves[i] > pCut1->pLeaves[k] )
        {
            pLeaves[c] = pCut1->pLeaves[k++];
            continue;
        }
        pLeaves[c] = pCut0->pLeaves[i++]; 
        k++;
    }
    if ( i < nLeaves0 || k < nLeaves1 )
        return NULL;
    p->pReady->nLeaves = c;
    pRes = p->pReady;  p->pReady = NULL;
    return pRes;
}